

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osstzprs.c
# Opt level: O2

char * parse_digits(int *val,char *p,size_t *len)

{
  int iVar1;
  ushort **ppuVar2;
  size_t sVar3;
  
  *val = 0;
  sVar3 = *len;
  while( true ) {
    if (sVar3 == 0) {
      return p;
    }
    ppuVar2 = __ctype_b_loc();
    if ((*(byte *)((long)*ppuVar2 + (long)*p * 2 + 1) & 8) == 0) break;
    iVar1 = *val;
    *val = iVar1 * 10;
    *val = iVar1 * 10 + (int)*p + -0x30;
    p = p + 1;
    sVar3 = *len - 1;
    *len = sVar3;
  }
  return p;
}

Assistant:

static const char *parse_digits(int *val, const char *p, size_t *len)
{
    for (*val = 0 ; *len != 0 && isdigit(*p) ; ++p, --*len)
    {
        *val *= 10;
        *val += *p - '0';
    }
    return p;
}